

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

uintwide_t<3072U,_unsigned_int,_void,_true> * __thiscall
math::wide_integer::uintwide_t<3072U,_unsigned_int,_void,_true>::operator-=
          (uintwide_t<3072U,_unsigned_int,_void,_true> *this,
          uintwide_t<3072U,_unsigned_int,_void,_true> *other)

{
  long lVar1;
  
  if (this == other) {
    for (lVar1 = 0; lVar1 != 0x180; lVar1 = lVar1 + 4) {
      *(undefined4 *)((long)(this->values).super_array<unsigned_int,_96UL>.elems + lVar1) = 0;
    }
  }
  else {
    uintwide_t<3072u,unsigned_int,void,true>::
    eval_subtract_n<unsigned_int*,unsigned_int_const*,unsigned_int_const*>
              ((uint *)this,(uint *)this,(uint *)other,0x60,false);
  }
  return this;
}

Assistant:

constexpr auto operator-=(const uintwide_t& other) -> uintwide_t&
    {
      if(this == &other)
      {
        detail::fill_unsafe(values.begin(), values.end(), static_cast<typename representation_type::value_type>(UINT8_C(0))); // LCOV_EXCL_LINE
      }
      else
      {
        // Unary subtraction function.
        const auto has_borrow = eval_subtract_n(values.begin(),
                                                values.cbegin(),
                                                other.values.cbegin(),
                                                number_of_limbs,
                                                false);

        static_cast<void>(has_borrow);
      }

      return *this;
    }